

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavInitWindow(ImGuiWindow *window,bool force_reinit)

{
  ImGuiNavLayer *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *g;
  ImGuiID IVar3;
  
  pIVar2 = GImGui;
  if (((uint)window->Flags >> 0x12 & 1) == 0) {
    if (((window->Flags & 0x5000000U) != 0x1000000) ||
       (IVar3 = window->NavLastIds[0], IVar3 == 0 || force_reinit)) {
      pIVar1 = &GImGui->NavLayer;
      GImGui->NavId = 0;
      pIVar2->NavWindow->NavLastIds[(int)*pIVar1] = 0;
      pIVar2->NavInitRequestFromMove = false;
      pIVar2->NavInitResultId = 0;
      (pIVar2->NavInitResultRectRel).Min.x = 0.0;
      (pIVar2->NavInitResultRectRel).Min.y = 0.0;
      (pIVar2->NavInitResultRectRel).Max.x = 0.0;
      (pIVar2->NavInitResultRectRel).Max.y = 0.0;
      pIVar2->NavAnyRequest = true;
      pIVar2->NavInitRequest = true;
      return;
    }
  }
  else {
    IVar3 = window->NavLastIds[0];
  }
  GImGui->NavId = IVar3;
  return;
}

Assistant:

void ImGui::NavInitWindow(ImGuiWindow* window, bool force_reinit)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(window == g.NavWindow);
    bool init_for_nav = false;
    if (!(window->Flags & ImGuiWindowFlags_NoNavInputs))
        if (!(window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_Popup) || (window->NavLastIds[0] == 0) || force_reinit)
            init_for_nav = true;
    //IMGUI_DEBUG_LOG("[Nav] NavInitWindow() init_for_nav=%d, window=\"%s\", layer=%d\n", init_for_nav, window->Name, g.NavLayer);
    if (init_for_nav)
    {
        SetNavID(0, g.NavLayer);
        g.NavInitRequest = true;
        g.NavInitRequestFromMove = false;
        g.NavInitResultId = 0;
        g.NavInitResultRectRel = ImRect();
        NavUpdateAnyRequestFlag();
    }
    else
    {
        g.NavId = window->NavLastIds[0];
    }
}